

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O0

bool __thiscall draco::PointCloudDecoder::DecodePointAttributesStep2(PointCloudDecoder *this)

{
  int32_t iVar1;
  int iVar2;
  int iVar3;
  pointer pAVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  long *in_RDI;
  int att_id;
  int j;
  int32_t num_attributes;
  int i;
  uint uVar8;
  int local_14;
  bool local_1;
  
  local_14 = 0;
  while( true ) {
    iVar1 = num_attributes_decoders((PointCloudDecoder *)0x18417d);
    if (iVar1 <= local_14) break;
    std::
    vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
    ::operator[]((vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                  *)(in_RDI + 2),(long)local_14);
    pAVar4 = std::
             unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
             ::operator->((unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                           *)0x1841a6);
    iVar2 = (*pAVar4->_vptr_AttributesDecoderInterface[6])();
    for (uVar8 = 0; (int)uVar8 < iVar2; uVar8 = uVar8 + 1) {
      std::
      vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
      ::operator[]((vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                    *)(in_RDI + 2),(long)local_14);
      pAVar4 = std::
               unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
               ::operator->((unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                             *)0x1841e4);
      iVar3 = (*pAVar4->_vptr_AttributesDecoderInterface[5])(pAVar4,(ulong)uVar8);
      uVar5 = (ulong)iVar3;
      sVar6 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 5));
      if (sVar6 <= uVar5) {
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar8,iVar3),(size_type)in_RDI);
      }
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 5),(long)iVar3);
      *pvVar7 = local_14;
    }
    local_14 = local_14 + 1;
  }
  uVar5 = (**(code **)(*in_RDI + 0x40))();
  if ((uVar5 & 1) == 0) {
    local_1 = false;
  }
  else {
    uVar5 = (**(code **)(*in_RDI + 0x48))();
    if ((uVar5 & 1) == 0) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool PointCloudDecoder::DecodePointAttributesStep2() {

  // Create map between attribute and decoder ids.
  for (int i = 0; i < num_attributes_decoders(); ++i) {
    const int32_t num_attributes = attributes_decoders_[i]->GetNumAttributes();
    for (int j = 0; j < num_attributes; ++j) {
      int att_id = attributes_decoders_[i]->GetAttributeId(j);
      if (att_id >= attribute_to_decoder_map_.size()) {
        attribute_to_decoder_map_.resize(att_id + 1);
      }
      attribute_to_decoder_map_[att_id] = i;
    }
  }

  // Decode the actual attributes using the created attribute decoders.
  if (!DecodeAllAttributes()) {
    return false;
  }

  if (!OnAttributesDecoded()) {
    return false;
  }
  return true;
}